

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall GlobOpt::FillBailOutInfo(GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo)

{
  OpCode OVar1;
  Type pSVar2;
  BasicBlock *pBVar3;
  JitArenaAllocator *pJVar4;
  BailOutInfo *pBVar5;
  GlobOpt *pGVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  uint *puVar11;
  Func **ppFVar12;
  StackSym **ppSVar13;
  Type *ppOVar14;
  StackSym *pSVar15;
  SymOpnd *pSVar16;
  RegOpnd *pRVar17;
  Value *pVVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar22;
  code *pcVar23;
  StackLiteralInitFldDataMap *pSVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  BasicBlock *count;
  Iterator local_80;
  StackLiteralInitFldDataMap *local_70;
  undefined4 *local_68;
  BasicBlock *local_60;
  BVSparse<Memory::JitArenaAllocator> *local_58;
  uint local_4c;
  BasicBlock *local_48;
  BailOutInfo *local_40;
  GlobOpt *local_38;
  
  local_60 = block;
  local_40 = bailOutInfo;
  local_38 = this;
  if ((this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3c7,"(!this->isCallHelper)",
                       "Bail out can\'t be inserted the middle of CallHelper sequence");
    if (!bVar7) goto LAB_0045f2b0;
    *puVar9 = 0;
  }
  pGVar6 = local_38;
  pBVar3 = local_60;
  pBVar10 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                      ((local_60->globOptData).liveVarSyms,local_38->func->m_alloc);
  pBVar5 = local_40;
  local_40->liveVarSyms = pBVar10;
  pBVar10 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                      ((pBVar3->globOptData).liveFloat64Syms,pGVar6->func->m_alloc);
  pBVar5->liveFloat64Syms = pBVar10;
  pcVar23 = (code *)(pBVar3->globOptData).liveLossyInt32Syms;
  pBVar10 = BVSparse<Memory::JitArenaAllocator>::MinusNew
                      ((pBVar3->globOptData).liveInt32Syms,
                       (BVSparse<Memory::JitArenaAllocator> *)pcVar23,pGVar6->func->m_alloc);
  pBVar5->liveLosslessInt32Syms = pBVar10;
  pSVar24 = (pBVar3->globOptData).stackLiteralInitFldDataMap;
  if ((pSVar24 != (StackLiteralInitFldDataMap *)0x0) &&
     (uVar21 = pSVar24->count - pSVar24->freeCount, uVar21 != 0)) {
    pcVar23 = Memory::ArenaAllocator::Alloc;
    uVar27 = 0;
    local_70 = pSVar24;
    local_4c = uVar21;
    local_48 = (BasicBlock *)
               Memory::
               AllocateArray<Memory::ArenaAllocator,BailOutInfo::StackLiteralBailOutInfo,false>
                         ((Memory *)local_38->func->m_alloc,
                          (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(ulong)uVar21);
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pSVar24 = local_70;
    uVar21 = local_4c;
    local_68 = puVar9;
    for (uVar20 = 0; uVar20 < pSVar24->bucketCount; uVar20 = uVar20 + 1) {
      iVar25 = pSVar24->buckets[uVar20];
      if (pSVar24->buckets[uVar20] != -1) {
        while (iVar25 != -1) {
          pSVar2 = pSVar24->entries;
          iVar26 = pSVar2[iVar25].
                   super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                   super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                   .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.next;
          pBVar3 = (BasicBlock *)
                   pSVar2[iVar25].
                   super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                   super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                   .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.key;
          if (uVar21 <= (uint)uVar27) {
            local_58 = (BVSparse<Memory::JitArenaAllocator> *)CONCAT44(local_58._4_4_,iVar26);
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x3e2,"(i < stackLiteralInitFldDataCount)",
                               "i < stackLiteralInitFldDataCount");
            if (!bVar7) goto LAB_0045f2b0;
            *puVar9 = 0;
            pSVar24 = local_70;
            uVar21 = local_4c;
            iVar26 = (int)local_58;
          }
          (&local_48->next)[uVar27 * 2] = pBVar3;
          *(uint *)(&local_48->prev + uVar27 * 2) =
               pSVar2[iVar25].
               super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
               super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
               .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.value.
               currentInitFldCount;
          uVar27 = (ulong)((uint)uVar27 + 1);
          pcVar23 = (code *)local_48;
          iVar25 = iVar26;
        }
      }
    }
    if ((uint)uVar27 != uVar21) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = local_68;
      *local_68 = 1;
      pcVar23 = (code *)0x3e8;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,1000,"(i == stackLiteralInitFldDataCount)",
                         "i == stackLiteralInitFldDataCount");
      if (!bVar7) goto LAB_0045f2b0;
      *puVar9 = 0;
      uVar21 = local_4c;
    }
    local_40->stackLiteralBailOutInfoCount = uVar21;
    local_40->stackLiteralBailOutInfo = (StackLiteralBailOutInfo *)local_48;
  }
  bVar7 = TrackArgumentsObject(local_38);
  if (bVar7) {
    CaptureArguments(local_38,(BasicBlock *)pcVar23,local_40,local_38->func->m_alloc);
  }
  pGVar6 = local_38;
  pBVar3 = local_60;
  pSVar22 = (local_60->globOptData).callSequence;
  if ((pSVar22 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     (uVar21 = 0,
     (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
     (pSVar22->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar22)) {
    pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
LAB_0045f290:
    CaptureValues(local_38,local_60,local_40,pBVar10);
    return;
  }
  uVar28 = (local_60->globOptData).startCallCount;
  count = (BasicBlock *)(ulong)uVar28;
  puVar11 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int,false>
                      ((Memory *)local_38->func->m_alloc,
                       (JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,(size_t)count);
  pBVar5 = local_40;
  local_40->startCallInfo = puVar11;
  local_40->startCallCount = uVar28;
  local_48 = count;
  ppFVar12 = Memory::AllocateArray<Memory::JitArenaAllocator,Func*,false>
                       ((Memory *)pGVar6->func->m_alloc,
                        (JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,(size_t)count);
  pBVar5->startCallFunc = ppFVar12;
  uVar28 = (pBVar3->globOptData).totalOutParamCount;
  uVar20 = (ulong)uVar28;
  pBVar5->totalOutParamCount = uVar28;
  ppSVar13 = Memory::AllocateArray<Memory::JitArenaAllocator,StackSym*,false>
                       ((Memory *)pGVar6->func->m_alloc,
                        (JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0,uVar20);
  pBVar5->argOutSyms = ppSVar13;
  pSVar22 = (pBVar3->globOptData).callSequence;
  local_80.list = pSVar22;
  local_80.current = &pSVar22->super_SListNodeBase<Memory::ArenaAllocator>;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_58 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  while( true ) {
    if (pSVar22 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_0045f2b0;
      *puVar9 = 0;
      pSVar22 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_80.current;
    }
    pBVar3 = local_48;
    pSVar22 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
              (pSVar22->super_SListNodeBase<Memory::ArenaAllocator>).next;
    uVar28 = (uint)uVar20;
    if (pSVar22 == local_80.list) break;
    local_80.current = (NodeBase *)pSVar22;
    ppOVar14 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_80);
    pSVar15 = IR::Opnd::GetStackSym(*ppOVar14);
    if ((pSVar15->field_0x1a & 0x30) == 0) {
      bVar7 = IR::Opnd::IsRegOpnd(*ppOVar14);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x42d,"(opnd->IsRegOpnd())","opnd->IsRegOpnd()");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      pRVar17 = IR::Opnd::AsRegOpnd(*ppOVar14);
      pSVar15 = pRVar17->m_sym;
      bVar7 = StackSym::IsArgSlotSym(pSVar15);
      pBVar3 = local_48;
      if (bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x42f,"(!sym->IsArgSlotSym())","!sym->IsArgSlotSym()");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      if ((pSVar15->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x430,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      if (((pSVar15->field_5).m_instrDef)->m_opcode != StartCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x431,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                           "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      if ((int)pBVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x433,"(startCallNumber != 0)","startCallNumber != 0");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      local_48 = (BasicBlock *)(ulong)((int)pBVar3 - 1);
      local_40->startCallFunc[(long)local_48] = ((pSVar15->field_5).m_instrDef)->m_func;
      uVar8 = IR::Instr::GetArgOutCount((pSVar15->field_5).m_instrDef,true);
      uVar20 = (ulong)(uVar28 - uVar8);
      if (uVar28 < uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x43e,"(totalOutParamCount >= argOutCount)",
                           "totalOutParamCount >= argOutCount");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      pBVar3 = local_48;
      if (uVar8 < uVar21) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x43f,"(argOutCount >= currentArgOutCount)",
                           "argOutCount >= currentArgOutCount");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      BailOutInfo::RecordStartCallInfo(local_40,(uint)pBVar3,(pSVar15->field_5).m_instrDef);
      uVar21 = 0;
      pSVar22 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_80.current;
    }
    else {
      bVar7 = IR::Opnd::IsSymOpnd(*ppOVar14);
      if (bVar7) {
        pSVar16 = IR::Opnd::AsSymOpnd(*ppOVar14);
        pSVar15 = Sym::AsStackSym(pSVar16->m_sym);
        bVar7 = StackSym::IsArgSlotSym(pSVar15);
        if (!bVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x40d,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
          if (!bVar7) goto LAB_0045f2b0;
          *puVar9 = 0;
        }
        if ((pSVar15->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x40e,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar7) goto LAB_0045f2b0;
          *puVar9 = 0;
        }
        OVar1 = ((pSVar15->field_5).m_instrDef)->m_opcode;
        uVar19 = OVar1 - 0x1ed;
        if (((6 < uVar19) || ((0x4bU >> (uVar19 & 0x1f) & 1) == 0)) && (OVar1 != ArgOut_A)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x413,
                             "(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic)"
                             ,
                             "sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic"
                            );
          if (!bVar7) goto LAB_0045f2b0;
          *puVar9 = 0;
        }
      }
      else {
        pSVar15 = IR::Opnd::GetStackSym(*ppOVar14);
        pVVar18 = GlobOptBlockData::FindValue
                            (&local_38->currentBlock->globOptData,&pSVar15->super_Sym);
        if (pVVar18 == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x418,"(this->currentBlock->globOptData.FindValue(sym))",
                             "this->currentBlock->globOptData.FindValue(sym)");
          if (!bVar7) goto LAB_0045f2b0;
          *puVar9 = 0;
        }
        pGVar6 = local_38;
        if (local_58 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          local_58 = (BVSparse<Memory::JitArenaAllocator> *)
                     new<Memory::JitArenaAllocator>(0x20,local_38->tempAlloc,0x3d6ef4);
          pJVar4 = pGVar6->tempAlloc;
          local_58->head = (Type_conflict)0x0;
          local_58->lastFoundIndex = (Type_conflict)0x0;
          local_58->alloc = pJVar4;
          local_58->lastUsedNodePrevNextField = (Type)local_58;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(local_58,(pSVar15->super_Sym).m_id);
      }
      if (uVar28 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x422,"(totalOutParamCount != 0)","totalOutParamCount != 0");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      if (uVar28 <= uVar21) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x423,"(totalOutParamCount > currentArgOutCount)",
                           "totalOutParamCount > currentArgOutCount");
        if (!bVar7) goto LAB_0045f2b0;
        *puVar9 = 0;
      }
      uVar21 = uVar21 + 1;
      local_40->argOutSyms[uVar28 - uVar21] = pSVar15;
      pSVar22 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_80.current;
    }
  }
  if (uVar28 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x448,"(totalOutParamCount == 0)","totalOutParamCount == 0");
    if (!bVar7) goto LAB_0045f2b0;
    *puVar9 = 0;
  }
  if ((int)pBVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x449,"(startCallNumber == 0)","startCallNumber == 0");
    if (!bVar7) goto LAB_0045f2b0;
    *puVar9 = 0;
  }
  pBVar10 = local_58;
  if (uVar21 == 0) goto LAB_0045f290;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar9 = 1;
  bVar7 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                     ,0x44a,"(currentArgOutCount == 0)","currentArgOutCount == 0");
  if (bVar7) {
    *puVar9 = 0;
    pBVar10 = local_58;
    goto LAB_0045f290;
  }
LAB_0045f2b0:
  pcVar23 = (code *)invalidInstructionException();
  (*pcVar23)();
}

Assistant:

void
GlobOpt::FillBailOutInfo(BasicBlock *block, BailOutInfo * bailOutInfo)
{
    AssertMsg(!this->isCallHelper, "Bail out can't be inserted the middle of CallHelper sequence");

    BVSparse<JitArenaAllocator>* argsToCapture = nullptr;

    bailOutInfo->liveVarSyms = block->globOptData.liveVarSyms->CopyNew(this->func->m_alloc);
    bailOutInfo->liveFloat64Syms = block->globOptData.liveFloat64Syms->CopyNew(this->func->m_alloc);
    // The live int32 syms in the bailout info are only the syms resulting from lossless conversion to int. If the int32 value
    // was created from a lossy conversion to int, the original var value cannot be re-materialized from the int32 value. So, the
    // int32 version is considered to be not live for the purposes of bailout, which forces the var or float versions to be used
    // directly for restoring the value during bailout. Otherwise, bailout may try to re-materialize the var value by converting
    // the lossily-converted int value back into a var, restoring the wrong value.
    bailOutInfo->liveLosslessInt32Syms =
        block->globOptData.liveInt32Syms->MinusNew(block->globOptData.liveLossyInt32Syms, this->func->m_alloc);

    // Save the stack literal init field count so we can null out the uninitialized fields
    StackLiteralInitFldDataMap * stackLiteralInitFldDataMap = block->globOptData.stackLiteralInitFldDataMap;
    if (stackLiteralInitFldDataMap != nullptr)
    {
        uint stackLiteralInitFldDataCount = stackLiteralInitFldDataMap->Count();
        if (stackLiteralInitFldDataCount != 0)
        {
            auto stackLiteralBailOutInfo = AnewArray(this->func->m_alloc,
                BailOutInfo::StackLiteralBailOutInfo, stackLiteralInitFldDataCount);
            uint i = 0;
            stackLiteralInitFldDataMap->Map(
                [stackLiteralBailOutInfo, stackLiteralInitFldDataCount, &i](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                Assert(i < stackLiteralInitFldDataCount);
                stackLiteralBailOutInfo[i].stackSym = stackSym;
                stackLiteralBailOutInfo[i].initFldCount = data.currentInitFldCount;
                i++;
            });

            Assert(i == stackLiteralInitFldDataCount);
            bailOutInfo->stackLiteralBailOutInfoCount = stackLiteralInitFldDataCount;
            bailOutInfo->stackLiteralBailOutInfo = stackLiteralBailOutInfo;
        }
    }

    if (TrackArgumentsObject())
    {
        this->CaptureArguments(block, bailOutInfo, this->func->m_alloc);
    }

    if (block->globOptData.callSequence && !block->globOptData.callSequence->Empty())
    {
        uint currentArgOutCount = 0;
        uint startCallNumber = block->globOptData.startCallCount;

        bailOutInfo->startCallInfo = JitAnewArray(this->func->m_alloc, BailOutInfo::StartCallInfo, startCallNumber);
        bailOutInfo->startCallCount = startCallNumber;

        // Save the start call's func to identify the function (inlined) that the call sequence is for
        // We might not have any arg out yet to get the function from
        bailOutInfo->startCallFunc = JitAnewArray(this->func->m_alloc, Func *, startCallNumber);
#ifdef _M_IX86
        bailOutInfo->inlinedStartCall = BVFixed::New(startCallNumber, this->func->m_alloc, false);
#endif
        uint totalOutParamCount = block->globOptData.totalOutParamCount;
        bailOutInfo->totalOutParamCount = totalOutParamCount;
        bailOutInfo->argOutSyms = JitAnewArrayZ(this->func->m_alloc, StackSym *, totalOutParamCount);

        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, block->globOptData.callSequence)
        {
            if(opnd->GetStackSym()->HasArgSlotNum())
            {
                StackSym * sym;
                if(opnd->IsSymOpnd())
                {
                    sym = opnd->AsSymOpnd()->m_sym->AsStackSym();
                    Assert(sym->IsArgSlotSym());
                    Assert(sym->m_isSingleDef);
                    Assert(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic);
                }
                else
                {
                    sym = opnd->GetStackSym();
                    Assert(this->currentBlock->globOptData.FindValue(sym));
                    // StackSym args need to be re-captured
                    if (!argsToCapture)
                    {
                        argsToCapture = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
                    }

                    argsToCapture->Set(sym->m_id);
                }

                Assert(totalOutParamCount != 0);
                Assert(totalOutParamCount > currentArgOutCount);
                currentArgOutCount++;
#pragma prefast(suppress:26000, "currentArgOutCount is never 0");
                bailOutInfo->argOutSyms[totalOutParamCount - currentArgOutCount] = sym;
                // Note that there could be ArgOuts below current bailout instr that belong to current call (currentArgOutCount < argOutCount),
                // in which case we will have nulls in argOutSyms[] in start of section for current call, because we fill from tail.
                // Example: StartCall 3, ArgOut1,.. ArgOut2, Bailout,.. Argout3 -> [NULL, ArgOut1, ArgOut2].
            }
            else
            {
                Assert(opnd->IsRegOpnd());
                StackSym * sym = opnd->AsRegOpnd()->m_sym;
                Assert(!sym->IsArgSlotSym());
                Assert(sym->m_isSingleDef);
                Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

                Assert(startCallNumber != 0);
                startCallNumber--;

                bailOutInfo->startCallFunc[startCallNumber] = sym->m_instrDef->m_func;
#ifdef _M_IX86
                if (sym->m_isInlinedArgSlot)
                {
                    bailOutInfo->inlinedStartCall->Set(startCallNumber);
                }
#endif
                uint argOutCount = sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
                Assert(totalOutParamCount >= argOutCount);
                Assert(argOutCount >= currentArgOutCount);

                bailOutInfo->RecordStartCallInfo(startCallNumber, sym->m_instrDef);
                totalOutParamCount -= argOutCount;
                currentArgOutCount = 0;
            }
        }
        NEXT_SLISTBASE_ENTRY;

        Assert(totalOutParamCount == 0);
        Assert(startCallNumber == 0);
        Assert(currentArgOutCount == 0);
    }

    // Save the constant values that we know so we can restore them directly.
    // This allows us to dead store the constant value assign.
    this->CaptureValues(block, bailOutInfo, argsToCapture);
}